

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test::TestBody
          (AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test *this)

{
  AV1Convolve2DIntraBCTest *in_stack_00008130;
  
  AV1Convolve2DIntraBCTest::SpeedTest(in_stack_00008130);
  return;
}

Assistant:

TEST_P(AV1Convolve2DIntraBCTest, DISABLED_SpeedTest) { SpeedTest(); }